

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
::emplace_new_key<slang::BufferID>
          (sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
           *this,int8_t distance_from_desired,EntryPointer current_entry,BufferID *key)

{
  char cVar1;
  uint32_t uVar2;
  anon_union_4_1_a8c68091_for_sherwood_v3_entry<slang::BufferID>_3 aVar3;
  EntryPointer psVar4;
  EntryPointer psVar5;
  EntryPointer psVar6;
  undefined8 in_RAX;
  char cVar7;
  long lVar8;
  anon_union_4_1_a8c68091_for_sherwood_v3_entry<slang::BufferID>_3 aVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
  pVar13;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((this->num_slots_minus_one != 0) && (this->max_lookups != distance_from_desired)) {
    uVar10 = this->num_elements + 1;
    auVar11._8_4_ = (int)(uVar10 >> 0x20);
    auVar11._0_8_ = uVar10;
    auVar11._12_4_ = 0x45300000;
    lVar8 = this->num_slots_minus_one + 1;
    auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = 0x45300000;
    if ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0) <=
        (double)this->_max_load_factor *
        ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0))) {
      cVar7 = current_entry->distance_from_desired;
      if (cVar7 < '\0') {
        (current_entry->field_1).value.id = key->id;
        current_entry->distance_from_desired = distance_from_desired;
        this->num_elements = uVar10;
      }
      else {
        uVar2 = key->id;
        current_entry->distance_from_desired = distance_from_desired;
        uVar10 = (ulong)(uint)current_entry->field_1;
        (current_entry->field_1).value.id = uVar2;
        cVar7 = cVar7 + '\x01';
        cVar1 = current_entry[1].distance_from_desired;
        psVar6 = current_entry + 1;
        psVar5 = current_entry;
        while (psVar4 = psVar6, aVar9 = SUB84(uVar10,0), -1 < cVar1) {
          if (cVar1 < cVar7) {
            psVar4->distance_from_desired = cVar7;
            aVar3 = psVar4->field_1;
            psVar4->field_1 = aVar9;
            cVar7 = cVar1 + '\x01';
            uVar10 = (ulong)(uint)aVar3;
          }
          else {
            cVar7 = cVar7 + '\x01';
            if (cVar7 == this->max_lookups) {
              key = (BufferID *)((long)&uStack_18 + 4);
              uStack_18 = CONCAT44(current_entry->field_1,(int)in_RAX);
              current_entry->field_1 = aVar9;
              goto LAB_00159108;
            }
          }
          psVar6 = psVar4 + 1;
          psVar5 = psVar4;
          cVar1 = psVar4[1].distance_from_desired;
        }
        psVar5[1].field_1 = aVar9;
        psVar4->distance_from_desired = cVar7;
        this->num_elements = this->num_elements + 1;
      }
      pVar13._9_7_ = (int7)(uVar10 >> 8);
      pVar13.second = true;
      pVar13.first.current = current_entry;
      return pVar13;
    }
  }
LAB_00159108:
  grow(this);
  pVar13 = emplace<slang::BufferID>(this,key);
  return pVar13;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }